

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

bool __thiscall QFileDialogPrivate::restoreFromSettings(QFileDialogPrivate *this)

{
  QFileDialog *this_00;
  QUrlPrivate *pQVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  ViewMode VVar5;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_lastVisitedDir>_> *this_01;
  Type *pTVar6;
  char *pcVar7;
  ViewMode mode;
  long lVar8;
  bool *pbVar9;
  QString *urlStr;
  QString *pQVar10;
  long in_FS_OFFSET;
  QAnyStringView QVar11;
  QAnyStringView QVar12;
  QAnyStringView QVar13;
  QAnyStringView QVar14;
  QAnyStringView QVar15;
  QAnyStringView QVar16;
  QAnyStringView QVar17;
  QArrayDataPointer<QString> local_118;
  QArrayDataPointer<QString> local_f8;
  bool ok;
  undefined1 local_d8 [16];
  QArrayDataPointer<char> local_c8;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  QUrl url;
  undefined8 uStack_90;
  undefined8 local_88;
  QArrayDataPointer<char16_t> local_78;
  QVariant local_58;
  long local_38;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 this_02;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFileDialog **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
  Qt::Literals::StringLiterals::operator____s((QString *)&local_58,L"QtProject",9);
  local_78.d = (Data *)0x0;
  local_78.ptr = (char16_t *)0x0;
  local_78.size = 0;
  bVar3 = false;
  QSettings::QSettings
            ((QSettings *)&local_a8,UserScope,(QString *)&local_58,(QString *)&local_78,
             (QObject *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  QSettings::childGroups();
  cVar2 = QtPrivate::QStringList_contains((QList_conflict *)&local_58,(QLatin1String *)0xa,0x66b0f3)
  ;
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_58);
  if (cVar2 != '\0') {
    QtPrivate::lengthHelperContainer<char,11ul>((char (*) [11])0x66b0f3);
    this_02.m_data = &local_a8;
    QVar11.m_size = (size_t)"FileDialog";
    QVar11.field_0.m_data = this_02.m_data;
    QSettings::beginGroup(QVar11);
    this_01 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_lastVisitedDir>_> *
              )QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_lastVisitedDir>_>::
               operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_lastVisitedDir>_>
                           *)this_02.m_data_utf8);
    cVar2 = QUrl::isEmpty();
    if (cVar2 == '\0') {
      pTVar6 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_lastVisitedDir>_>::
               operator()(this_01);
      QUrl::QUrl((QUrl *)&local_78,pTVar6);
    }
    else {
      QtPrivate::lengthHelperContainer<char,12ul>((char (*) [12])0x66b245);
      QVar12.m_size = (size_t)&local_a8;
      QVar12.field_0.m_data = &local_58;
      QSettings::value(QVar12);
      ::QVariant::toUrl();
    }
    QFileDialog::setDirectoryUrl(this_00,(QUrl *)&local_78);
    QUrl::~QUrl((QUrl *)&local_78);
    if (cVar2 != '\0') {
      ::QVariant::~QVariant(&local_58);
    }
    local_c8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QtPrivate::lengthHelperContainer<char,9ul>((char (*) [9])"viewMode");
    QVar13.m_size = (size_t)&local_a8;
    QVar13.field_0.m_data = &local_78;
    QSettings::value(QVar13);
    ::QVariant::toString();
    QString::toLatin1_helper_inplace((QString *)&local_c8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&url);
    ::QVariant::~QVariant((QVariant *)&local_78);
    iVar4 = (*(code *)**(undefined8 **)&(this_00->super_QDialog).super_QWidget)(this_00);
    pcVar7 = (char *)(*(code *)**(undefined8 **)&(this_00->super_QDialog).super_QWidget)(this_00);
    QMetaObject::indexOfEnumerator(pcVar7);
    local_d8 = QMetaObject::enumerator(iVar4);
    ok = false;
    pbVar9 = (bool *)local_c8.ptr;
    if ((bool *)local_c8.ptr == (bool *)0x0) {
      pbVar9 = (bool *)&QByteArray::_empty;
    }
    VVar5 = QMetaEnum::keyToValue(local_d8,pbVar9);
    mode = List;
    if (ok != false) {
      mode = VVar5;
    }
    QFileDialog::setViewMode(this_00,mode);
    QtPrivate::lengthHelperContainer<char,10ul>((char (*) [10])"shortcuts");
    QVar14.m_size = (size_t)&local_a8;
    QVar14.field_0.m_data = &local_78;
    QSettings::value(QVar14);
    ::QVariant::toStringList();
    QUrl::fromStringList((QList_conflict *)&url,(ParsingMode)&local_f8);
    QArrayDataPointer<QUrl>::operator=(&(this->sidebarUrls).d,(QArrayDataPointer<QUrl> *)&url);
    QArrayDataPointer<QUrl>::~QArrayDataPointer((QArrayDataPointer<QUrl> *)&url);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_f8);
    ::QVariant::~QVariant((QVariant *)&local_78);
    QtPrivate::lengthHelperContainer<char,15ul>((char (*) [15])"treeViewHeader");
    QVar15.m_size = (size_t)&local_a8;
    QVar15.field_0.m_data = &local_78;
    QSettings::value(QVar15);
    ::QVariant::toByteArray();
    pQVar1 = (QUrlPrivate *)(this->headerData).d.d;
    (this->headerData).d.d = (Data *)url.d;
    (this->headerData).d.ptr = (char *)uStack_90;
    (this->headerData).d.size = local_88;
    url.d = pQVar1;
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&url);
    ::QVariant::~QVariant((QVariant *)&local_78);
    bVar3 = true;
    if (((this->super_QDialogPrivate).nativeDialogInUse == false) &&
       ((this->qFileDialogUi).d != (Ui_QFileDialog *)0x0)) {
      local_f8.size = 0;
      local_f8.d = (Data *)0x0;
      local_f8.ptr = (QString *)0x0;
      local_118.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_118.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_118.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      QtPrivate::lengthHelperContainer<char,8ul>((char (*) [8])"history");
      QVar16.m_size = (size_t)&local_a8;
      QVar16.field_0.m_data = &local_78;
      QSettings::value(QVar16);
      ::QVariant::toStringList();
      ::QVariant::~QVariant((QVariant *)&local_78);
      pQVar10 = local_118.ptr;
      for (lVar8 = local_118.size * 0x18; lVar8 != 0; lVar8 = lVar8 + -0x18) {
        url.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
        QUrl::QUrl(&url,(QString *)pQVar10,TolerantMode);
        cVar2 = QUrl::isLocalFile();
        if (cVar2 != '\0') {
          QUrl::toLocalFile();
          QList<QString>::emplaceBack<QString>((QList<QString> *)&local_f8,(QString *)&local_78);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
        }
        QUrl::~QUrl(&url);
        pQVar10 = pQVar10 + 1;
      }
      QtPrivate::lengthHelperContainer<char,13ul>((char (*) [13])"sidebarWidth");
      ::QVariant::QVariant((QVariant *)&url,-1);
      QVar17.m_size = (size_t)&local_a8;
      QVar17.field_0.m_data_utf8 = (char *)&local_78;
      QSettings::value(QVar17,(QVariant *)"sidebarWidth");
      iVar4 = ::QVariant::toInt((bool *)&local_78);
      bVar3 = restoreWidgetState(this,(QStringList *)&local_f8,iVar4);
      ::QVariant::~QVariant((QVariant *)&local_78);
      ::QVariant::~QVariant((QVariant *)&url);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_118);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_f8);
    }
    QArrayDataPointer<char>::~QArrayDataPointer(&local_c8);
  }
  QSettings::~QSettings((QSettings *)&local_a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileDialogPrivate::restoreFromSettings()
{
    Q_Q(QFileDialog);
    QSettings settings(QSettings::UserScope, u"QtProject"_s);
    if (!settings.childGroups().contains("FileDialog"_L1))
        return false;
    settings.beginGroup("FileDialog");

    q->setDirectoryUrl(lastVisitedDir()->isEmpty() ? settings.value("lastVisited").toUrl() : *lastVisitedDir());

    QByteArray viewModeStr = settings.value("viewMode").toString().toLatin1();
    const QMetaEnum &viewModeMeta = q->metaObject()->enumerator(q->metaObject()->indexOfEnumerator("ViewMode"));
    bool ok = false;
    int viewMode = viewModeMeta.keyToValue(viewModeStr.constData(), &ok);
    if (!ok)
        viewMode = QFileDialog::List;
    q->setViewMode(static_cast<QFileDialog::ViewMode>(viewMode));

    sidebarUrls = QUrl::fromStringList(settings.value("shortcuts").toStringList());
    headerData = settings.value("treeViewHeader").toByteArray();

    if (!usingWidgets())
        return true;

    QStringList history;
    const auto urlStrings = settings.value("history").toStringList();
    for (const QString &urlStr : urlStrings) {
        QUrl url(urlStr);
        if (url.isLocalFile())
            history << url.toLocalFile();
    }

    return restoreWidgetState(history, settings.value("sidebarWidth", -1).toInt());
}